

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

Solution * Utils::random_solution(void)

{
  size_t *psVar1;
  Point *p;
  ulong uVar2;
  int iVar3;
  Solution *s;
  Vehicle *pVVar4;
  _List_node_base *p_Var5;
  ulong uVar6;
  Solution *pSVar7;
  bool bVar8;
  bool bVar9;
  int ec;
  int ec_1;
  list<Point_*,_std::allocator<Point_*>_> point_pool;
  int local_58;
  int local_54;
  Solution *local_50;
  _List_node_base local_48;
  ulong local_38;
  
  s = (Solution *)operator_new(0x20);
  (s->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)s;
  (s->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)s;
  (s->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node._M_size = 0;
  pVVar4 = (Vehicle *)operator_new(0x28);
  Vehicle::Vehicle(pVVar4,s);
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5[1]._M_next = (_List_node_base *)pVVar4;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(s->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 + 1;
  std::__cxx11::list<Point_*,_std::allocator<Point_*>_>::list
            ((list<Point_*,_std::allocator<Point_*>_> *)&local_48,&raw_rows_abi_cxx11_);
  p_Var5 = local_48._M_next;
  local_38 = local_38 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var5);
  if (local_48._M_next != &local_48) {
    local_50 = s;
    do {
      p_Var5 = local_48._M_next;
      iVar3 = rand();
      uVar6 = (ulong)(long)iVar3 % local_38;
      if ((long)uVar6 < 1) {
        for (; uVar6 != 0; uVar6 = uVar6 + 1) {
          p_Var5 = p_Var5->_M_prev;
        }
      }
      else {
        do {
          p_Var5 = p_Var5->_M_next;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      p = (Point *)p_Var5[1]._M_next;
      local_38 = local_38 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var5);
      local_58 = 0;
      pSVar7 = (Solution *)
               (s->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node
               .super__List_node_base._M_next;
      bVar9 = pSVar7 == s;
      while (!bVar9) {
        pVVar4 = (Vehicle *)
                 (pSVar7->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
                 _M_node._M_size;
        uVar6 = 0xffffffffffffffff;
        bVar8 = false;
        do {
          local_58 = 0;
          Vehicle::add_node(pVVar4,p,(int)uVar6 + 1,&local_58);
          if (local_58 == 0) {
            if (!bVar8) goto LAB_00107512;
            break;
          }
          uVar6 = uVar6 + 1;
          uVar2 = (pVVar4->nodes).
                  super__List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
                  ._M_impl._M_node._M_size;
          bVar8 = uVar2 <= uVar6;
        } while (uVar6 < uVar2);
        pSVar7 = (Solution *)
                 (pSVar7->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
                 _M_node.super__List_node_base._M_next;
        bVar9 = pSVar7 == local_50;
      }
LAB_00107512:
      s = local_50;
      if ((bVar9) && (local_58 != 0)) {
        pVVar4 = (Vehicle *)operator_new(0x28);
        Vehicle::Vehicle(pVVar4,s);
        p_Var5 = (_List_node_base *)operator_new(0x18);
        p_Var5[1]._M_next = (_List_node_base *)pVVar4;
        std::__detail::_List_node_base::_M_hook(p_Var5);
        psVar1 = &(s->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        local_54 = 0;
        Vehicle::add_node(pVVar4,p,0,&local_54);
      }
    } while (local_48._M_next != &local_48);
  }
  Solution::total_weight(s);
  while (local_48._M_next != &local_48) {
    p_Var5 = (((_List_base<Point_*,_std::allocator<Point_*>_> *)&(local_48._M_next)->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(local_48._M_next);
    local_48._M_next = p_Var5;
  }
  return s;
}

Assistant:

Solution *Utils::random_solution() {
    auto solution = new Solution;
    auto v = new Vehicle(solution);
    solution->vehicles.push_back(v);

    auto point_pool = Utils::raw_rows;
    point_pool.erase(point_pool.begin());
    while (!point_pool.empty()) {
        auto pit = point_pool.begin();
        std::advance(pit, rand() % point_pool.size());
        auto p = *pit;
        point_pool.erase(pit);
        auto ec = 0;
        for (auto vehicle: solution->vehicles) {
            for (auto i = 0; i <= vehicle->nodes.size(); ++i) {
                ec = 0;
                vehicle->add_node(p, i, ec);
                if (ec == 0)
                    goto leave;
            }
        }

        if (ec != 0) {
            v = new Vehicle(solution);
            solution->vehicles.push_back(v);
            auto ec = 0;
            v->add_node(p, 0, ec);
        }
        leave:;
    }
    solution->total_weight();
    return solution;
}